

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  void *pvVar7;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  bool bVar8;
  pointer pvVar9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar10;
  Option *pOVar11;
  int iVar12;
  ulong uVar13;
  void *pvVar14;
  pointer pfVar15;
  float *pfVar16;
  int *piVar17;
  uint uVar18;
  long lVar19;
  BBoxRect *__args;
  int iVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<int,_std::allocator<int>_> picked;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  vector<float,_std::allocator<float>_> local_198;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  pointer local_168;
  int local_160;
  uint local_15c;
  void *local_158;
  iterator iStack_150;
  int *local_148;
  vector<float,_std::allocator<float>_> local_138;
  ulong local_118;
  pointer local_110;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  int *piStack_d0;
  undefined8 local_c8;
  Allocator *local_c0;
  undefined8 local_b8;
  uint local_b0;
  undefined4 local_ac;
  long local_a8;
  int *local_98;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_90;
  Option *local_88;
  void *local_80;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  
  local_110 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  uVar22 = local_110[2].w;
  local_118 = (ulong)uVar22;
  uVar18 = uVar22;
  if ((int)uVar22 < 0) {
    uVar18 = uVar22 + 3;
  }
  local_15c = (int)uVar18 >> 2;
  local_c0 = opt->workspace_allocator;
  local_d8 = 0;
  piStack_d0 = (int *)0x0;
  local_c8 = 4;
  local_b8 = 0x400000002;
  local_ac = 1;
  local_a8 = (long)(int)(uVar18 & 0xfffffffc);
  iVar20 = -100;
  if (6 < uVar22 + 3) {
    uVar24 = local_a8 * 4;
    local_b0 = local_15c;
    local_90 = top_blobs;
    local_88 = opt;
    if (local_c0 == (Allocator *)0x0) {
      pvVar14 = malloc(uVar24 + 0x1c);
      uVar13 = (long)pvVar14 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar13 - 8) = pvVar14;
    }
    else {
      uVar13 = (*(code *)**(undefined8 **)local_c0)(local_c0,uVar24 | 4);
    }
    piStack_d0 = (int *)(uVar24 + uVar13);
    *(undefined4 *)(uVar13 + uVar24) = 1;
    local_d8 = uVar13;
    local_98 = piStack_d0;
    if (3 < (int)local_118) {
      pvVar14 = local_110->data;
      pvVar7 = local_110[2].data;
      iVar20 = local_110[2].w;
      uVar24 = (ulong)local_15c;
      lVar21 = 0;
      local_80 = pvVar7;
      do {
        uVar4 = *(undefined8 *)((long)pvVar7 + lVar21 + (long)iVar20 * 4);
        uVar5 = *(undefined8 *)((long)pvVar7 + lVar21 + (long)iVar20 * 4 + 8);
        uVar6 = *(undefined8 *)((long)pvVar14 + lVar21);
        local_e8 = CONCAT44((float)((ulong)uVar6 >> 0x20) * (float)((ulong)uVar4 >> 0x20),
                            (float)uVar6 * (float)uVar4);
        uStack_e0 = 0;
        uVar4 = *(undefined8 *)((long)pvVar14 + lVar21 + 8);
        fVar26 = (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar5 >> 0x20);
        local_58 = CONCAT44(fVar26,(float)uVar4 * (float)uVar5);
        uStack_50 = 0;
        local_48 = expf(fVar26);
        fVar26 = expf((float)local_58);
        pfVar16 = (float *)((long)local_80 + lVar21);
        fVar28 = pfVar16[2] - *pfVar16;
        fVar29 = pfVar16[3] - pfVar16[1];
        fVar25 = (*pfVar16 + pfVar16[2]) * 0.5 + fVar28 * (float)local_e8;
        fVar27 = (pfVar16[1] + pfVar16[3]) * 0.5 + fVar29 * local_e8._4_4_;
        fVar26 = fVar26 * fVar28 * 0.5;
        fVar28 = local_48 * fVar29 * 0.5;
        pfVar16 = (float *)(uVar13 + lVar21);
        *pfVar16 = fVar25 - fVar26;
        pfVar16[1] = fVar27 - fVar28;
        pfVar16[2] = fVar25 + fVar26;
        pfVar16[3] = fVar27 + fVar28;
        lVar21 = lVar21 + 0x10;
      } while (uVar24 << 4 != lVar21);
    }
    local_78.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&local_78,(long)this->num_class);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&local_108,(long)this->num_class);
    if (this->num_class < 2) {
      local_178 = (undefined1  [8])0x0;
      uStack_170 = (pointer)0x0;
      local_168 = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
    }
    else {
      lVar21 = 1;
      do {
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if (3 < (int)local_118) {
          uVar22 = 0;
          do {
            iVar20 = (int)lVar21;
            fVar26 = *(float *)((long)local_110[1].data +
                               (long)(int)(this->num_class * uVar22 + iVar20) * 4);
            local_158 = (void *)CONCAT44(local_158._4_4_,fVar26);
            if (this->confidence_threshold <= fVar26 && fVar26 != this->confidence_threshold) {
              lVar19 = (long)(int)uVar22 * (long)local_b8._4_4_;
              local_178._4_4_ = *(undefined4 *)(local_d8 + 4 + lVar19 * 4);
              local_178._0_4_ = *(undefined4 *)(local_d8 + lVar19 * 4);
              uStack_170 = (pointer)CONCAT44(*(float *)(local_d8 + 0xc + lVar19 * 4),
                                             *(float *)(local_d8 + 8 + lVar19 * 4));
              local_168 = (pointer)CONCAT44(local_168._4_4_,iVar20);
              if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                _M_realloc_insert<ncnn::BBoxRect_const&>
                          ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_198,
                           (iterator)
                           local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(BBoxRect *)local_178);
              }
              else {
                *(int *)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + 0x10) = iVar20;
                *(undefined1 (*) [8])
                 local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_178;
                *(pointer *)
                 ((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + 8) = uStack_170;
                local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 0x14);
              }
              if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_138,
                           (iterator)
                           local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_158);
              }
              else {
                *local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_158._0_4_;
                local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar22 = uVar22 + 1;
          } while (local_15c != uVar22);
        }
        qsort_descent_inplace<ncnn::BBoxRect>
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_198,&local_138)
        ;
        iVar20 = this->nms_top_k;
        iVar12 = (int)((ulong)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        if (SBORROW4(iVar20,iVar12 * -0x33333333) != iVar20 + iVar12 * 0x33333333 < 0) {
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_198,
                     (long)iVar20);
          std::vector<float,_std::allocator<float>_>::resize(&local_138,(long)this->nms_top_k);
        }
        local_158 = (void *)0x0;
        iStack_150._M_current = (int *)0x0;
        local_148 = (int *)0x0;
        local_e8 = CONCAT44(local_e8._4_4_,this->nms_threshold);
        uVar22 = (int)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) * -0x33333333;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_178,(long)(int)uVar22,
                   (allocator_type *)&local_160);
        if (0 < (int)uVar22) {
          pfVar15 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 2;
          uVar24 = 0;
          do {
            ((float *)local_178)[uVar24] =
                 ((float)((ulong)*(undefined8 *)pfVar15 >> 0x20) -
                 (float)((ulong)*(undefined8 *)(pfVar15 + -2) >> 0x20)) *
                 ((float)*(undefined8 *)pfVar15 - (float)*(undefined8 *)(pfVar15 + -2));
            uVar24 = uVar24 + 1;
            pfVar15 = pfVar15 + 5;
          } while ((uVar22 & 0x7fffffff) != uVar24);
          local_160 = 0;
          do {
            uVar18 = (uint)((ulong)((long)iStack_150._M_current - (long)local_158) >> 2);
            if ((int)uVar18 < 1) {
LAB_0012ce26:
              if (iStack_150._M_current == local_148) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_158,iStack_150,&local_160);
              }
              else {
                *iStack_150._M_current = local_160;
                iStack_150._M_current = iStack_150._M_current + 1;
              }
            }
            else {
              pfVar16 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)local_160 * 5;
              fVar26 = *pfVar16;
              bVar8 = true;
              uVar24 = 0;
              do {
                lVar19 = (long)*(int *)((long)local_158 + uVar24 * 4);
                fVar25 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar19 * 5 + 2];
                fVar27 = 0.0;
                if (fVar26 <= fVar25) {
                  pfVar1 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar19 * 5;
                  fVar28 = pfVar16[2];
                  fVar29 = *pfVar1;
                  if (fVar29 <= fVar28) {
                    fVar2 = pfVar16[1];
                    fVar30 = pfVar1[3];
                    if (fVar2 <= fVar30) {
                      fVar3 = pfVar16[3];
                      fVar31 = pfVar1[1];
                      if (fVar31 <= fVar3) {
                        if (fVar28 <= fVar25) {
                          fVar25 = fVar28;
                        }
                        if (fVar29 <= fVar26) {
                          fVar29 = fVar26;
                        }
                        if (fVar3 <= fVar30) {
                          fVar30 = fVar3;
                        }
                        if (fVar31 <= fVar2) {
                          fVar31 = fVar2;
                        }
                        fVar27 = (fVar30 - fVar31) * (fVar25 - fVar29);
                      }
                    }
                  }
                }
                if ((float)local_e8 <
                    fVar27 / ((((float *)local_178)[local_160] - fVar27) +
                             ((float *)local_178)[lVar19])) {
                  bVar8 = false;
                }
                uVar24 = uVar24 + 1;
              } while ((uVar18 & 0x7fffffff) != uVar24);
              if (bVar8) goto LAB_0012ce26;
            }
            local_160 = local_160 + 1;
          } while (local_160 < (int)uVar22);
        }
        if (local_178 != (undefined1  [8])0x0) {
          operator_delete((void *)local_178,(long)local_168 - (long)local_178);
        }
        if (0 < (int)((ulong)((long)iStack_150._M_current - (long)local_158) >> 2)) {
          lVar19 = 0;
          do {
            lVar23 = (long)*(int *)((long)local_158 + lVar19 * 4);
            __args = (BBoxRect *)
                     (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar23 * 5);
            this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                      (local_78.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar21);
            __position._M_current = *(BBoxRect **)(this_00 + 8);
            if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
              std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
              _M_realloc_insert<ncnn::BBoxRect_const&>(this_00,__position,__args);
            }
            else {
              (__position._M_current)->label = __args->label;
              fVar26 = __args->ymin;
              fVar25 = __args->xmax;
              fVar27 = __args->ymax;
              (__position._M_current)->xmin = __args->xmin;
              (__position._M_current)->ymin = fVar26;
              (__position._M_current)->xmax = fVar25;
              (__position._M_current)->ymax = fVar27;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
            }
            this_01 = (vector<float,std::allocator<float>> *)
                      (local_108.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar21);
            __position_00._M_current = *(float **)(this_01 + 8);
            if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_01,__position_00,
                         local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar23);
            }
            else {
              *__position_00._M_current =
                   local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar23];
              *(float **)(this_01 + 8) = __position_00._M_current + 1;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < (int)((ulong)((long)iStack_150._M_current - (long)local_158) >> 2));
        }
        if (local_158 != (void *)0x0) {
          operator_delete(local_158,(long)local_148 - (long)local_158);
        }
        if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < this->num_class);
      local_178 = (undefined1  [8])0x0;
      uStack_170 = (pointer)0x0;
      local_168 = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if (1 < this->num_class) {
        lVar21 = 1;
        lVar19 = 0x20;
        do {
          pvVar9 = local_108.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                    ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)local_178,uStack_170,
                     *(undefined8 *)
                      ((long)local_78.
                             super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar19 + -8),
                     *(undefined8 *)
                      ((long)&((local_78.
                                super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar19));
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)&local_198,
                     local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,*(undefined8 *)((long)pvVar9 + lVar19 + -8),
                     *(undefined8 *)
                      ((long)&(pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar19));
          lVar21 = lVar21 + 1;
          lVar19 = lVar19 + 0x18;
        } while (lVar21 < this->num_class);
      }
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_178,&local_198);
    pOVar11 = local_88;
    pvVar10 = local_90;
    iVar20 = this->keep_top_k;
    iVar12 = (int)((ulong)((long)uStack_170 - (long)local_178) >> 2);
    uVar22 = iVar12 * -0x33333333;
    if (SBORROW4(iVar20,uVar22) != iVar20 + iVar12 * 0x33333333 < 0) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_178,(long)iVar20);
      std::vector<float,_std::allocator<float>_>::resize(&local_198,(long)this->keep_top_k);
      uVar22 = (int)((ulong)((long)uStack_170 - (long)local_178) >> 2) * -0x33333333;
    }
    this_02 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_02,6,uVar22,4,pOVar11->blob_allocator);
    iVar20 = -100;
    if ((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if ((int)uVar22 < 1) {
        iVar20 = 0;
      }
      else {
        iVar12 = this_02->w;
        piVar17 = (int *)((long)local_178 + 0x10);
        pfVar16 = (float *)((long)this_02->data + 0x14);
        iVar20 = 0;
        uVar24 = 0;
        do {
          fVar26 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar24];
          pfVar16[-5] = (float)*piVar17;
          pfVar16[-4] = fVar26;
          pfVar16[-3] = ((BBoxRect *)(piVar17 + -4))->xmin;
          pfVar16[-2] = (float)piVar17[-3];
          pfVar16[-1] = (float)piVar17[-2];
          *pfVar16 = (float)piVar17[-1];
          uVar24 = uVar24 + 1;
          piVar17 = piVar17 + 5;
          pfVar16 = pfVar16 + iVar12;
        } while (uVar22 != uVar24);
      }
    }
    if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_178 != (undefined1  [8])0x0) {
      operator_delete((void *)local_178,(long)local_168 - (long)local_178);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_108);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&local_78);
    LOCK();
    *local_98 = *local_98 + -1;
    UNLOCK();
    if (*local_98 == 0) {
      if (local_c0 == (Allocator *)0x0) {
        if (local_d8 != 0) {
          free(*(void **)(local_d8 - 8));
        }
      }
      else {
        (**(code **)(*(long *)local_c0 + 8))();
      }
    }
  }
  return iVar20;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    const int num_prior = priorbox.w / 4;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr + i * 4;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = exp(var[2] * loc[2]) * pb_w;
        float bbox_h = exp(var[3] * loc[3]) * pb_h;

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class);
    all_class_bbox_scores.resize(num_class);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            float score = confidence[j * num_class + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<int> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = bbox_rects.size();

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label;
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}